

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regiongraph.cpp
# Opt level: O0

void __thiscall libDAI::RegionGraph::RecomputeORs(RegionGraph *this,VarSet *ns)

{
  bool bVar1;
  size_t sVar2;
  FRegion *pFVar3;
  iterator ns_00;
  TFactor<double> *in_RDI;
  TFactor<double> *unaff_retaddr;
  fac2OR_cit I;
  size_t alpha;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_stack_ffffffffffffff98;
  RegionGraph *in_stack_ffffffffffffffa0;
  Factor *in_stack_ffffffffffffffa8;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_30;
  iterator in_stack_ffffffffffffffd8;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> in_stack_ffffffffffffffe0;
  ulong local_18;
  TFactor<double> *Q;
  
  Q = in_RDI;
  for (local_18 = 0; sVar2 = nr_ORs((RegionGraph *)0xb94d45), local_18 < sVar2;
      local_18 = local_18 + 1) {
    pFVar3 = OR(in_stack_ffffffffffffffa0,(long)in_stack_ffffffffffffff98);
    TFactor<double>::vars(&pFVar3->super_Factor);
    bVar1 = VarSet::operator&&((VarSet *)in_stack_ffffffffffffffe0._M_node,
                               (VarSet *)in_stack_ffffffffffffffd8._M_node);
    if (bVar1) {
      OR(in_stack_ffffffffffffffa0,(long)in_stack_ffffffffffffff98);
      TFactor<double>::fill
                ((TFactor<double> *)in_stack_ffffffffffffffa0,(double)in_stack_ffffffffffffff98);
    }
  }
  ns_00 = std::
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::begin(in_stack_ffffffffffffff98);
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
  _Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)
             &stack0xffffffffffffffe0,(iterator *)&stack0xffffffffffffffd8);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::end(in_stack_ffffffffffffff98);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
    _Rb_tree_const_iterator(&local_30,&local_38);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,&local_30);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)
               in_stack_ffffffffffffffa0);
    pFVar3 = OR(in_stack_ffffffffffffffa0,(long)in_stack_ffffffffffffff98);
    TFactor<double>::vars(&pFVar3->super_Factor);
    bVar1 = VarSet::operator&&((VarSet *)in_stack_ffffffffffffffe0._M_node,(VarSet *)ns_00._M_node);
    if (bVar1) {
      in_stack_ffffffffffffffa0 =
           (RegionGraph *)
           &(in_RDI->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)
                 in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffffa8 =
           FactorGraph::factor((FactorGraph *)in_stack_ffffffffffffffa0,
                               (size_t)in_stack_ffffffffffffff98);
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)
                 in_stack_ffffffffffffffa0);
      OR(in_stack_ffffffffffffffa0,(long)in_stack_ffffffffffffff98);
      TFactor<double>::operator*=(unaff_retaddr,Q);
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)
               in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  }
  return;
}

Assistant:

void RegionGraph::RecomputeORs( const VarSet &ns ) {
        for( size_t alpha = 0; alpha < nr_ORs(); alpha++ )
            if( OR(alpha).vars() && ns )
                OR(alpha).fill( 1.0 );
        for( fac2OR_cit I = _fac2OR.begin(); I != _fac2OR.end(); I++ )
            if( OR( I->second ).vars() && ns )
                OR( I->second ) *= _fg.factor( I->first );
    }